

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O2

_Bool parse_PRG_rom(uint8_t *rom_data)

{
  uint8_t *puVar1;
  uint8_t **ppuVar2;
  uint8_t *puVar3;
  long lVar4;
  uint uVar5;
  uint8_t bank_num;
  ulong uVar6;
  char *__s;
  
  uVar5 = (uint)parsed_header.PRG_ROM_chunks;
  ppuVar2 = (uint8_t **)malloc((ulong)(uVar5 * 8));
  PRG_rom_banks = ppuVar2;
  if (ppuVar2 == (uint8_t **)0x0) {
    __s = "ERROR: Failed to malloc pointers for PRG_ROM banks";
  }
  else {
    uVar6 = 0;
    __s = "ERROR: Failed to malloc space for PRG_ROM bank";
    do {
      if (uVar5 == uVar6) {
        puVar3 = rom_data + 0x10;
        for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
          puVar1 = ppuVar2[uVar6];
          for (lVar4 = 0; lVar4 != 0x4000; lVar4 = lVar4 + 1) {
            puVar1[lVar4] = puVar3[lVar4];
          }
          puVar3 = puVar3 + 0x4000;
        }
        return false;
      }
      puVar3 = (uint8_t *)malloc(0x4000);
      ppuVar2[uVar6] = puVar3;
      uVar6 = uVar6 + 1;
    } while (puVar3 != (uint8_t *)0x0);
  }
  puts(__s);
  return true;
}

Assistant:

bool parse_PRG_rom(uint8_t* rom_data) {
    PRG_rom_banks = malloc(parsed_header.PRG_ROM_chunks * sizeof(uint8_t*));
    if(PRG_rom_banks == NULL) {
        printf("ERROR: Failed to malloc pointers for PRG_ROM banks\n");
        return true;
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        PRG_rom_banks[bank_num] = malloc(PRG_BANK_SIZE * sizeof(uint8_t));
        if(PRG_rom_banks[bank_num] == NULL) {
            printf("ERROR: Failed to malloc space for PRG_ROM bank\n");
            return true;
        }
    }

    uint32_t bank_starting_rom_address;
    uint32_t bank_ending_rom_address;
    uint8_t* bank_to_fill;
    uint16_t bank_address;
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        bank_starting_rom_address = GAME_DATA_START + (PRG_BANK_SIZE * bank_num);
        bank_ending_rom_address   = GAME_DATA_START + (PRG_BANK_SIZE * (bank_num + 1));
        bank_to_fill              = PRG_rom_banks[bank_num];
        bank_address              = 0;

        for(uint32_t rom_address = bank_starting_rom_address; rom_address < bank_ending_rom_address; rom_address++) {
            bank_to_fill[bank_address++] = rom_data[rom_address];
        }
    }

    return false;
}